

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void nh_timeout(void)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  obj *poVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  uint uStack_1c;
  boolean nostone;
  int time_luck;
  int baseluck;
  int m_idx;
  int sleeptime;
  prop *upp;
  
  uStack_1c = (uint)(flags.moonphase == 4);
  if (flags.friday13 != '\0') {
    uStack_1c = uStack_1c - 1;
  }
  if ((int)u.uluck != uStack_1c) {
    uVar7 = 600;
    if ((u.uhave._0_1_ & 1) != 0 || u.ugangr != 0) {
      uVar7 = 300;
    }
    if ((int)((ulong)moves % uVar7) == 0) {
      iVar2 = stone_luck('\0');
      poVar5 = carrying(0x20f);
      bVar9 = false;
      if (poVar5 == (obj *)0x0) {
        iVar3 = stone_luck('\x01');
        bVar9 = iVar3 == 0;
      }
      if (((int)uStack_1c < (int)u.uluck) && ((bVar9 || (iVar2 < 0)))) {
        u.uluck = u.uluck + -1;
      }
      else if (((int)u.uluck < (int)uStack_1c) && ((bVar9 || (0 < iVar2)))) {
        u.uluck = u.uluck + '\x01';
      }
    }
  }
  if (u.uprops[0x3e].intrinsic != 0) {
    phasing_dialogue();
  }
  if (((byte)u._1052_1_ >> 4 & 1) == 0) {
    if (u.uprops[0x21].intrinsic != 0) {
      stoned_dialogue();
    }
    if (u.uprops[0x3a].intrinsic != 0) {
      slime_dialogue();
    }
    if (u.uprops[0x2f].intrinsic != 0) {
      vomiting_dialogue();
    }
    if (u.uprops[0x22].intrinsic != 0) {
      choke_dialogue();
    }
    if ((u.mtimedone != 0) && (u.mtimedone = u.mtimedone + -1, u.mtimedone == 0)) {
      if ((u.uprops[0x3d].intrinsic == 0) && (u.uprops[0x3d].extrinsic == 0)) {
        rehumanize();
      }
      else {
        u.mtimedone = rnd((youmonst.data)->mlevel * 100 + 1);
      }
    }
    if (u.ucreamed != 0) {
      u.ucreamed = u.ucreamed - 1;
    }
    if (((u.usptime != '\0') && (u.usptime = u.usptime + 0xff, u.usptime == '\0')) &&
       (u.uspellprot != '\0')) {
      u.usptime = u.uspmtime;
      u.uspellprot = u.uspellprot + 0xff;
      find_ac();
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pcVar6 = hcolor("golden");
        pcVar8 = "disappears";
        if (u.uspellprot != '\0') {
          pcVar8 = "becomes less dense";
        }
        Norep("The %s haze around you %s.",pcVar6,pcVar8);
      }
    }
    if (((u.ugallop != 0) && (u.ugallop = u.ugallop + -1, u.ugallop == 0)) &&
       (u.usteed != (monst *)0x0)) {
      pcVar6 = Monnam(u.usteed);
      pline("%s stops galloping.",pcVar6);
    }
    for (_m_idx = 0x3d4af8; _m_idx < 0x3d4e1c; _m_idx = _m_idx + 0xc) {
      if (((*(uint *)(_m_idx + 8) & 0xffffff) != 0) &&
         (uVar4 = *(int *)(_m_idx + 8) - 1, *(uint *)(_m_idx + 8) = uVar4, (uVar4 & 0xffffff) == 0))
      {
        uVar4 = u.uprops[0x25].intrinsic;
        switch(((long)(_m_idx - 0x3d4af8) >> 2) * -0x5555555555555555) {
        case 0xc:
          set_mimic_blocking();
          see_monsters();
          newsym((int)u.ux,(int)u.uy);
          stop_occupation();
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0xd:
          newsym((int)u.ux,(int)u.uy);
          uVar4 = u.uprops[0x25].intrinsic;
          if ((((((u.uprops[0xd].intrinsic == 0) && (u.uprops[0xd].extrinsic == 0)) &&
                ((youmonst.data != mons + 0x9e && (youmonst.data != mons + 0x7b)))) ||
               (u.uprops[0xd].blocked != 0)) && (u.uprops[0xd].blocked == 0)) &&
             (((u.uprops[0x1e].intrinsic == 0 &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
            bVar9 = true;
            if ((u.uprops[0xc].intrinsic == 0) && (bVar9 = true, u.uprops[0xc].extrinsic == 0)) {
              bVar9 = ((youmonst.data)->mflags1 & 0x1000000) != 0;
            }
            pcVar6 = "You can no longer see through yourself.";
            if ((bool)(bVar9 ^ 1)) {
              pcVar6 = "You are no longer invisible.";
            }
            pline(pcVar6);
            stop_occupation();
            uVar4 = u.uprops[0x25].intrinsic;
          }
          break;
        case 0x12:
          float_down(0x10ffffff,0);
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x1a:
          if (((u.uprops[0x1a].intrinsic & 0xf8ffffff) == 0) && (u.uprops[0x1a].extrinsic == 0)) {
            pcVar6 = "";
            if (u.uprops[0x1a].intrinsic != 0) {
              pcVar6 = " a bit";
            }
            pline("You feel yourself slowing down%s.",pcVar6);
            uVar4 = u.uprops[0x25].intrinsic;
          }
          break;
        case 0x1b:
          u.uprops[0x1b].intrinsic = 1;
          make_stunned(0,'\x01');
          stop_occupation();
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x1c:
          u.uprops[0x1c].intrinsic = 1;
          make_confused(0,'\x01');
          stop_occupation();
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x1d:
          pline("You die from your illness.");
          killer_format = 0;
          killer = u.usick_cause;
          iVar2 = name_to_mon(u.usick_cause);
          if (-1 < iVar2) {
            if ((mons[iVar2].mflags2 & 0x80000) == 0) {
              if ((mons[iVar2].geno & 0x1000) != 0) {
                killer = the(killer);
                strcpy(u.usick_cause,killer);
                killer_format = 1;
              }
            }
            else {
              killer_format = 1;
            }
          }
          u._971_1_ = u._971_1_ & 0xfc;
          done(2);
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x1e:
          u.uprops[0x1e].intrinsic = 1;
          make_blinded(0,'\x01');
          stop_occupation();
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x1f:
          bVar1 = unconscious();
          if ((bVar1 == '\0') &&
             (((((u.uprops[3].intrinsic == 0 && (u.uprops[3].extrinsic == 0)) &&
                ((youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) ||
              ((((u.uprops[3].intrinsic & 0x4000000) != 0 &&
                ((u.uprops[3].intrinsic & 0xfbffffff) == 0)) &&
               ((u.uprops[3].extrinsic == 0 &&
                (((youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))))))))) {
            if ((u.uprops[0x1f].intrinsic != 0) ||
               (uVar4 = u.uprops[0x25].intrinsic, u.uprops[0x1f].extrinsic != 0)) {
              pline("You fall asleep.");
              bVar9 = false;
              if (((u.uprops[3].intrinsic & 0x4000000) != 0) &&
                 (((bVar9 = false, (u.uprops[3].intrinsic & 0xfbffffff) == 0 &&
                   (bVar9 = false, u.uprops[3].extrinsic == 0)) &&
                  (bVar9 = false, (youmonst.mintrinsics & 4) == 0)))) {
                bVar9 = u.uprops[0x38].extrinsic == 0;
              }
              iVar2 = 0x14;
              if (bVar9) {
                iVar2 = 10;
              }
              iVar2 = rnd(iVar2);
              fall_asleep(-iVar2,'\x01');
              iVar3 = rnd(100);
              u.uprops[0x1f].intrinsic = iVar2 + iVar3 + u.uprops[0x1f].intrinsic;
              uVar4 = u.uprops[0x25].intrinsic;
            }
          }
          else {
            iVar2 = rnd(100);
            u.uprops[0x1f].intrinsic = iVar2 + u.uprops[0x1f].intrinsic;
            uVar4 = u.uprops[0x25].intrinsic;
          }
          break;
        case 0x20:
          heal_legs();
          stop_occupation();
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x21:
          if ((delayed_killer != (char *)0x0) && (killer == (char *)0x0)) {
            killer = delayed_killer;
            delayed_killer = (char *)0x0;
          }
          if (killer == (char *)0x0) {
            killer_format = 2;
            killer = "killed by petrification";
          }
          done(8);
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x22:
          killer_format = 1;
          killer = "strangulation";
          if (((byte)u._1052_1_ >> 5 & 1) != 0) {
            killer = "suffocation";
          }
          done(0);
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x23:
          u.uprops[0x23].intrinsic = 1;
          make_hallucinated(0,'\x01',0);
          stop_occupation();
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x25:
          if ((((u.umoved != '\0') && (u.uprops[0x12].intrinsic == 0)) &&
              (u.uprops[0x12].extrinsic == 0)) && ((youmonst.data)->mlet != '\x05')) {
            slip_or_trip();
            nomul(-2,"fumbling");
            nomovemsg = "";
            iVar2 = inv_weight();
            if (-500 < iVar2) {
              pline("You make a lot of noise!");
              wake_nearby();
            }
          }
          u.uprops[0x25].intrinsic = u.uprops[0x25].intrinsic & 0xfbffffff;
          if ((u.uprops[0x25].intrinsic != 0) || (uVar4 = 0, u.uprops[0x25].extrinsic != 0)) {
            iVar2 = rnd(0x14);
            uVar4 = iVar2 + u.uprops[0x25].intrinsic;
          }
          break;
        case 0x2f:
          make_vomiting(0,'\x01');
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x3a:
          if ((delayed_killer != (char *)0x0) && (killer == (char *)0x0)) {
            killer = delayed_killer;
            delayed_killer = (char *)0x0;
          }
          if (killer == (char *)0x0) {
            killer_format = 2;
            killer = "turned into green slime";
          }
          done(9);
          uVar4 = u.uprops[0x25].intrinsic;
          break;
        case 0x42:
          see_monsters();
          uVar4 = u.uprops[0x25].intrinsic;
        }
        u.uprops[0x25].intrinsic = uVar4;
      }
    }
    run_timers();
  }
  return;
}

Assistant:

void nh_timeout(void)
{
	struct prop *upp;
	int sleeptime;
	int m_idx;
	int baseluck = (flags.moonphase == FULL_MOON) ? 1 : 0;

	if (flags.friday13) baseluck -= 1;

	if (u.uluck != baseluck &&
		moves % (u.uhave.amulet || u.ugangr ? 300 : 600) == 0) {
	/* Cursed luckstones stop bad luck from timing out; blessed luckstones
	 * stop good luck from timing out; normal luckstones stop both;
	 * neither is stopped if you don't have a luckstone.
	 * Luck is based at 0 usually, +1 if a full moon and -1 on Friday 13th
	 */
	    int time_luck = stone_luck(FALSE);
	    boolean nostone = !carrying(LUCKSTONE) && !stone_luck(TRUE);

	    if (u.uluck > baseluck && (nostone || time_luck < 0))
		u.uluck--;
	    else if (u.uluck < baseluck && (nostone || time_luck > 0))
		u.uluck++;
	}
	if (Phasing) phasing_dialogue();
	if (u.uinvulnerable) return; /* things past this point could kill you */
	if (Stoned) stoned_dialogue();
	if (Slimed) slime_dialogue();
	if (Vomiting) vomiting_dialogue();
	if (Strangled) choke_dialogue();
	if (u.mtimedone && !--u.mtimedone) {
		if (Unchanging)
			u.mtimedone = rnd(100*youmonst.data->mlevel + 1);
		else
			rehumanize();
	}
	if (u.ucreamed) u.ucreamed--;

	/* Dissipate spell-based protection. */
	if (u.usptime) {
	    if (--u.usptime == 0 && u.uspellprot) {
		u.usptime = u.uspmtime;
		u.uspellprot--;
		find_ac();
		if (!Blind)
		    Norep("The %s haze around you %s.", hcolor("golden"),
			  u.uspellprot ? "becomes less dense" : "disappears");
	    }
	}

	if (u.ugallop) {
	    if (--u.ugallop == 0L && u.usteed)
	    	pline("%s stops galloping.", Monnam(u.usteed));
	}

	for (upp = u.uprops; upp < u.uprops+SIZE(u.uprops); upp++)
	    if ((upp->intrinsic & TIMEOUT) && !(--upp->intrinsic & TIMEOUT)) {
		switch(upp - u.uprops){
		case STONED:
			if (delayed_killer && !killer) {
				killer = delayed_killer;
				delayed_killer = 0;
			}
			if (!killer) {
				/* leaving killer_format would make it
				   "petrified by petrification" */
				killer_format = NO_KILLER_PREFIX;
				killer = "killed by petrification";
			}
			done(STONING);
			break;
		case SLIMED:
			if (delayed_killer && !killer) {
				killer = delayed_killer;
				delayed_killer = 0;
			}
			if (!killer) {
				killer_format = NO_KILLER_PREFIX;
				killer = "turned into green slime";
			}
			done(TURNED_SLIME);
			break;
		case VOMITING:
			make_vomiting(0L, TRUE);
			break;
		case SICK:
			pline("You die from your illness.");
			killer_format = KILLED_BY_AN;
			killer = u.usick_cause;
			if ((m_idx = name_to_mon(killer)) >= LOW_PM) {
			    if (type_is_pname(&mons[m_idx])) {
				killer_format = KILLED_BY;
			    } else if (mons[m_idx].geno & G_UNIQ) {
				killer = the(killer);
				strcpy(u.usick_cause, killer);
				killer_format = KILLED_BY;
			    }
			}
			u.usick_type = 0;
			done(POISONING);
			break;
		case FAST:
			if (!Very_fast)
				pline("You feel yourself slowing down%s.",
							Fast ? " a bit" : "");
			break;
		case CONFUSION:
			HConfusion = 1; /* So make_confused works properly */
			make_confused(0L, TRUE);
			stop_occupation();
			break;
		case STUNNED:
			HStun = 1;
			make_stunned(0L, TRUE);
			stop_occupation();
			break;
		case BLINDED:
			Blinded = 1;
			make_blinded(0L, TRUE);
			stop_occupation();
			break;
		case INVIS:
			newsym(u.ux,u.uy);
			if (!Invis && !BInvis && !Blind) {
			    pline(!See_invisible ?
				    "You are no longer invisible." :
				    "You can no longer see through yourself.");
			    stop_occupation();
			}
			break;
		case SEE_INVIS:
			set_mimic_blocking(); /* do special mimic handling */
			see_monsters();		/* make invis mons appear */
			newsym(u.ux,u.uy);	/* make self appear */
			stop_occupation();
			break;
		case WOUNDED_LEGS:
			heal_legs();
			stop_occupation();
			break;
		case HALLUC:
			HHallucination = 1;
			make_hallucinated(0L, TRUE, 0L);
			stop_occupation();
			break;
		case SLEEPING:
			if (unconscious() || FSleep_resistance) {
				HSleeping += rnd(100);
			} else if (Sleeping) {
				pline("You fall asleep.");
				sleeptime = rnd(PSleep_resistance ? 10 : 20);
				fall_asleep(-sleeptime, TRUE);
				HSleeping += sleeptime + rnd(100);
			}
			break;
		case LEVITATION:
			float_down(I_SPECIAL|TIMEOUT, 0L);
			break;
		case STRANGLED:
			killer_format = KILLED_BY;
			killer = (u.uburied) ? "suffocation" : "strangulation";
			done(DIED);
			break;
		case FUMBLING:
			/* call this only when a move took place.  */
			/* otherwise handle fumbling msgs locally. */
			if (u.umoved && !Levitation) {
			    slip_or_trip();
			    nomul(-2, "fumbling");
			    nomovemsg = "";
			    /* The more you are carrying the more likely you
			     * are to make noise when you fumble.  Adjustments
			     * to this number must be thoroughly play tested.
			     */
			    if ((inv_weight() > -500)) {
				pline("You make a lot of noise!");
				wake_nearby();
			    }
			}
			/* from outside means slippery ice; don't reset
			   counter if that's the only fumble reason */
			HFumbling &= ~FROMOUTSIDE;
			if (Fumbling)
			    HFumbling += rnd(20);
			break;
		case DETECT_MONSTERS:
			see_monsters();
			break;
		}
	}

	run_timers();
}